

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpReply.hpp
# Opt level: O2

string * HttpReply::ExtractCookie(string *__return_storage_ptr__,string *reply,char *cookie)

{
  long lVar1;
  ulong uVar2;
  allocator *paVar3;
  allocator local_1a;
  allocator local_19;
  
  lVar1 = std::__cxx11::string::find((char *)reply,(ulong)cookie);
  if (lVar1 == -1) {
    paVar3 = &local_19;
  }
  else {
    lVar1 = std::__cxx11::string::find((char)reply,0x3d);
    uVar2 = std::__cxx11::string::find_first_of((char *)reply,0x129336);
    if (uVar2 != 0xffffffffffffffff && lVar1 + 1U < uVar2) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)reply);
      return __return_storage_ptr__;
    }
    paVar3 = &local_1a;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",paVar3);
  return __return_storage_ptr__;
}

Assistant:

static std::string ExtractCookie(const std::string& reply, const char* cookie) {
        size_t valueStart = reply.find(cookie);
        if (valueStart == std::string::npos) return "";
        valueStart = reply.find('=', valueStart) + 1;
        size_t valueEnd = reply.find_first_of(";\r", valueStart);
        if (valueEnd == std::string::npos || valueEnd <= valueStart) return "";
        return reply.substr(valueStart, valueEnd - valueStart);
    }